

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

int __thiscall re2::Regexp::NumCaptures(Regexp *this)

{
  NumCapturesWalker w;
  NumCapturesWalker NStack_78;
  
  NumCapturesWalker::NumCapturesWalker(&NStack_78);
  Walker<int>::Walk(&NStack_78.super_Walker<int>,this,0);
  Walker<int>::~Walker(&NStack_78.super_Walker<int>);
  return NStack_78.ncapture_;
}

Assistant:

int Regexp::NumCaptures() {
  NumCapturesWalker w;
  w.Walk(this, 0);
  return w.ncapture();
}